

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.hh
# Opt level: O0

void __thiscall Typelib::BadName::BadName(BadName *this,string *name)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38 [32];
  string *local_18;
  string *name_local;
  BadName *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  std::operator+(local_38,(char *)name);
  RegistryException::RegistryException(&this->super_RegistryException,local_38);
  std::__cxx11::string::~string((string *)local_38);
  *(undefined ***)&this->super_RegistryException = &PTR__BadName_00227e40;
  std::__cxx11::string::string((string *)&this->m_name,(string *)local_18);
  return;
}

Assistant:

BadName(const std::string& name)
            : RegistryException(name + " is not a valid type name")
            , m_name(name) {}